

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined **ppuVar4;
  ErrnoGuard guard;
  __shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (use(Catch::Colour::Code)::impl != '\0') goto LAB_0018afaf;
  iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
  if (iVar1 == 0) goto LAB_0018afaf;
  ErrnoGuard::ErrnoGuard(&guard);
  pIVar2 = getCurrentMutableContext();
  iVar1 = (*(pIVar2->super_IContext)._vptr_IContext[4])(pIVar2);
  clara::std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             (__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var,iVar1));
  if (local_28._M_ptr == (element_type *)0x0) {
LAB_0018b01f:
    iVar1 = isatty(1);
    if (iVar1 != 0) goto LAB_0018b02b;
LAB_0018b03e:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance == '\0') {
      pcVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
      ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_0018b0a9;
    }
    ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar1 = (*((local_28._M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x12])();
    if (iVar1 != 1) {
      if (iVar1 == 0) goto LAB_0018b01f;
      goto LAB_0018b03e;
    }
LAB_0018b02b:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance == '\0') {
      pcVar3 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
LAB_0018b0a9:
      if (iVar1 != 0) {
        __cxa_guard_release(pcVar3);
      }
    }
    else {
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    }
  }
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  ErrnoGuard::~ErrnoGuard(&guard);
  use::impl = (IColourImpl *)ppuVar4;
  __cxa_guard_release(&use(Catch::Colour::Code)::impl);
LAB_0018afaf:
  if (use::impl != (IColourImpl *)0x0) {
    (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  }
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = platformColourInstance();
        // Strictly speaking, this cannot possibly happen.
        // However, under some conditions it does happen (see #1626),
        // and this change is small enough that we can let practicality
        // triumph over purity in this case.
        if (impl != nullptr) {
            impl->use( _colourCode );
        }
    }